

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

void __thiscall QRasterPaintEngine::fillRect(QRasterPaintEngine *this,QRectF *r,QBrush *brush)

{
  QPaintEngineState *pQVar1;
  QPaintEngineState *pQVar2;
  
  pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
  pQVar2 = pQVar1 + -2;
  if (pQVar1 == (QPaintEngineState *)0x0) {
    pQVar2 = (QPaintEngineState *)0x0;
  }
  ensureBrush(this,brush);
  if (*(long *)(pQVar2 + 0xbc) != 0) {
    fillRect(this,r,(QSpanData *)(pQVar2 + 0xba));
    return;
  }
  return;
}

Assistant:

void QRasterPaintEngine::fillRect(const QRectF &r, const QBrush &brush)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << "QRasterPaintEngine::fillRecct(): " << r << brush;
#endif
    QRasterPaintEngineState *s = state();

    ensureBrush(brush);
    if (!s->brushData.blend)
        return;

    fillRect(r, &s->brushData);
}